

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall PrimitiveTestClass::AddValues(PrimitiveTestClass *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  char *pcVar5;
  uchar *__s;
  short *psVar6;
  unsigned_short *puVar7;
  int *piVar8;
  uint *puVar9;
  long *plVar10;
  unsigned_long *puVar11;
  longlong *plVar12;
  unsigned_long_long *puVar13;
  float *pfVar14;
  double *pdVar15;
  longdouble *plVar16;
  long *plVar17;
  ulong *puVar18;
  undefined8 *puVar19;
  element_type *peVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  this->us = 0xffff;
  this->c = -1;
  this->uc = 0xff;
  this->s = -1;
  this->i = 0xfffff;
  this->ui = 0xfffff;
  this->l = 0xfffff;
  this->ul = 0xfffff;
  this->ll = 0xfffff;
  this->ull = 0xfffff;
  this->f = 1.342323;
  this->d = 432.324324324;
  this->ld = (longdouble)423432.3465435435;
  pcVar5 = (char *)operator_new__(0xd);
  this->str = pcVar5;
  builtin_strncpy(pcVar5,"Hello World!",0xd);
  uVar21 = (ulong)this->SIZE;
  pcVar5 = (char *)operator_new__(uVar21);
  if (uVar21 == 0) {
    this->pc = pcVar5;
    __s = (uchar *)operator_new__(0);
  }
  else {
    memset(pcVar5,0xff,uVar21);
    this->pc = pcVar5;
    __s = (uchar *)operator_new__(uVar21);
    memset(__s,0xff,uVar21);
  }
  this->puc = __s;
  psVar6 = FillValues<short*>(this);
  this->ps = psVar6;
  puVar7 = FillValues<unsigned_short*>(this);
  this->pus = puVar7;
  piVar8 = FillValues<int*>(this);
  this->pi = piVar8;
  puVar9 = FillValues<unsigned_int*>(this);
  this->pui = puVar9;
  plVar10 = FillValues<long*>(this);
  this->pl = plVar10;
  puVar11 = FillValues<unsigned_long*>(this);
  this->pul = puVar11;
  plVar12 = FillValues<long_long*>(this);
  this->pll = plVar12;
  puVar13 = FillValues<unsigned_long_long*>(this);
  this->pull = puVar13;
  pfVar14 = FillValues<float*>(this);
  this->pf = pfVar14;
  pdVar15 = FillValues<double*>(this);
  this->pd = pdVar15;
  plVar16 = FillValues<long_double*>(this);
  this->pld = plVar16;
  iVar1 = this->SIZE;
  lVar22 = (long)iVar1;
  lVar23 = lVar22 * 0x20;
  uVar21 = 0xffffffffffffffff;
  if (-1 < lVar22) {
    uVar21 = lVar23 + 8;
  }
  plVar10 = (long *)operator_new__(uVar21);
  *plVar10 = lVar22;
  if (lVar22 == 0) {
    this->pto = (TestArrObj *)(plVar10 + 1);
  }
  else {
    plVar17 = plVar10 + 3;
    do {
      plVar17[-2] = (long)plVar17;
      plVar17[-1] = 0;
      *(undefined1 *)plVar17 = 0;
      plVar17 = plVar17 + 4;
      lVar23 = lVar23 + -0x20;
    } while (lVar23 != 0);
    this->pto = (TestArrObj *)(plVar10 + 1);
    if (iVar1 != 0) {
      lVar22 = 0;
      uVar21 = 0;
      do {
        std::__cxx11::string::_M_replace
                  ((long)&(this->pto->str)._M_dataplus._M_p + lVar22,0,
                   *(char **)((long)&(this->pto->str)._M_string_length + lVar22),0x136dc8);
        uVar21 = uVar21 + 1;
        iVar1 = this->SIZE;
        lVar22 = lVar22 + 0x20;
      } while (uVar21 < (ulong)(long)iVar1);
      uVar21 = 0xffffffffffffffff;
      if (-1 < iVar1) {
        uVar21 = (long)iVar1 << 2;
      }
      goto LAB_00117514;
    }
  }
  uVar21 = 0;
LAB_00117514:
  piVar8 = (int *)operator_new__(uVar21);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(a_Stack_30,piVar8);
  _Var4._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = piVar8;
  (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
     a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  if (this->SIZE == 0) {
    puVar19 = (undefined8 *)operator_new__(8);
    *puVar19 = 0;
    peVar20 = (element_type *)(puVar19 + 1);
  }
  else {
    peVar3 = (this->spi).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar21 = 0;
    do {
      peVar3[uVar21] = 10;
      uVar21 = uVar21 + 1;
      iVar1 = this->SIZE;
      uVar24 = (ulong)iVar1;
    } while (uVar21 < uVar24);
    lVar22 = uVar24 * 0x20;
    uVar21 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar21 = lVar22 + 8;
    }
    puVar18 = (ulong *)operator_new__(uVar21);
    peVar20 = (element_type *)(puVar18 + 1);
    *puVar18 = uVar24;
    if (iVar1 != 0) {
      puVar18 = puVar18 + 3;
      do {
        puVar18[-2] = (ulong)puVar18;
        puVar18[-1] = 0;
        *(undefined1 *)puVar18 = 0;
        puVar18 = puVar18 + 4;
        lVar22 = lVar22 + -0x20;
      } while (lVar22 != 0);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestArrObj*,std::default_delete<TestArrObj[]>,std::allocator<void>,void>
            (a_Stack_30);
  _Var4._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar20;
  (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
     a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  if (this->SIZE != 0) {
    lVar22 = 0;
    uVar21 = 0;
    do {
      peVar20 = (this->spto).super___shared_ptr<TestArrObj,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::_M_replace
                ((long)&(peVar20->str)._M_dataplus._M_p + lVar22,0,
                 *(char **)((long)&(peVar20->str)._M_string_length + lVar22),0x136dc8);
      uVar21 = uVar21 + 1;
      lVar22 = lVar22 + 0x20;
    } while (uVar21 < (ulong)(long)this->SIZE);
  }
  return;
}

Assistant:

void AddValues()
        {
            c = 0xFF;
            uc = 0xFF;
            s = 0xFFFF;
            us = 0xFFFF;
            i = 0xFFFFF;
            ui = 0xFFFFF;
            l = 0xFFFFF;
            ul = 0xFFFFF;
            ll = 0xFFFFF;
            ull = 0xFFFFF;
            f = 1.342323;
            d = 432.324324324;
            ld = 423432.3465435435;

            str = new char[strlen("Hello World!") + 1];
            strcpy(str, "Hello World!");
            str[strlen("Hello World!")] = '\0';

            pc = FillValues<char *>();
            puc = FillValues<unsigned char *>();
            ps = FillValues<short *>();
            pus = FillValues<unsigned short *>();
            pi = FillValues<int *>();
            pui = FillValues<unsigned int *>();
            pl = FillValues<long *>();
            pul = FillValues<unsigned long *>();
            pll = FillValues<long long *>();
            pull = FillValues<unsigned long long *>();
            pf = FillValues<float *>();
            pd = FillValues<double *>();
            pld = FillValues<long double *>();

            pto = new TestArrObj[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                pto[i].SetVal();
            }
            
            spi = shared_ptr<int>(new int[SIZE]);
            for (size_t i = 0; i < SIZE; i++)
            {
                (&*spi)[i] = 10;
            }

            spto = shared_ptr<TestArrObj>(new TestArrObj[SIZE], default_delete<TestArrObj[]>());
            for (size_t i = 0; i < SIZE; i++)
            {
                (&*spto)[i].SetVal();
            }   
        }